

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int GmfSetLin(int64_t MshIdx,int KwdCod,...)

{
  double dVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  char in_AL;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  void **ppvVar8;
  long in_RCX;
  long lVar9;
  long lVar10;
  uint *in_RDX;
  uint *puVar11;
  char *pcVar12;
  int iVar13;
  uint *in_R8;
  undefined8 in_R9;
  uint *puVar14;
  ulong uVar15;
  undefined4 *puVar16;
  undefined4 in_XMM0_Da;
  undefined4 uVar17;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list VarArg;
  undefined8 local_108;
  void **local_100;
  void *local_e8 [2];
  uint *local_d8;
  long local_d0;
  uint *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (KwdCod < 0) {
    KwdCod = -KwdCod;
    puVar16 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar17 = 5;
  }
  else {
    puVar16 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar17 = *puVar16;
  }
  if (KwdCod - 0xf1U < 0xffffff10) {
    return 0;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar5 = _setjmp((__jmp_buf_tag *)(MshIdx + 0x48));
  if (iVar5 != 0) {
    return 0;
  }
  iVar5 = _setjmp((__jmp_buf_tag *)(MshIdx + 0x48));
  puVar14 = local_c8;
  lVar9 = local_d0;
  puVar11 = local_d8;
  if (iVar5 != 0) {
    return 0;
  }
  local_100 = &VarArg[0].overflow_arg_area;
  local_108 = 0x3000000010;
  switch(uVar17) {
  case 1:
  case 2:
  case 4:
    if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
      if (0 < (int)puVar16[3]) {
        lVar9 = 0;
        do {
          cVar2 = *(char *)((long)puVar16 + lVar9 + 0xfd8);
          if (cVar2 == 'c') {
            uVar6 = local_108 & 0xffffffff;
            if (uVar6 < 0x29) {
              local_108 = CONCAT44(local_108._4_4_,(uint)local_108 + 8);
              ppvVar8 = (void **)((long)local_e8 + uVar6);
            }
            else {
              ppvVar8 = local_100;
              local_100 = local_100 + 1;
            }
            pcVar12 = (char *)*ppvVar8;
            sVar7 = strlen(pcVar12);
            if (0x3f < sVar7) {
              pcVar12[0x40] = '\0';
            }
            fputs(pcVar12,*(FILE **)(MshIdx + 0x300410));
          }
          else if (cVar2 == 'i') {
            uVar6 = local_108 & 0xffffffff;
            if (*(int *)(MshIdx + 4) < 4) {
              if ((uint)local_108 < 0x29) {
                local_108 = CONCAT44(local_108._4_4_,(uint)local_108 + 8);
                ppvVar8 = (void **)((long)local_e8 + uVar6);
              }
              else {
                ppvVar8 = local_100;
                local_100 = local_100 + 1;
              }
              fprintf(*(FILE **)(MshIdx + 0x300410),"%d ",(ulong)*(uint *)ppvVar8);
            }
            else {
              if ((uint)local_108 < 0x29) {
                local_108 = CONCAT44(local_108._4_4_,(uint)local_108 + 8);
                ppvVar8 = (void **)((long)local_e8 + uVar6);
              }
              else {
                ppvVar8 = local_100;
                local_100 = local_100 + 1;
              }
              fprintf(*(FILE **)(MshIdx + 0x300410),"%ld ",*ppvVar8);
            }
          }
          else if (cVar2 == 'r') {
            uVar6 = (ulong)local_108._4_4_;
            if (*(int *)(MshIdx + 0x18) == 0x20) {
              if (local_108._4_4_ < 0xa1) {
                local_108 = CONCAT44(local_108._4_4_ + 0x10,(uint)local_108);
                ppvVar8 = (void **)((long)local_e8 + uVar6);
              }
              else {
                ppvVar8 = local_100;
                local_100 = local_100 + 1;
              }
              uVar17 = SUB84(*ppvVar8,0);
              pcVar12 = "%.9g ";
            }
            else {
              if (local_108._4_4_ < 0xa1) {
                local_108 = CONCAT44(local_108._4_4_ + 0x10,(uint)local_108);
                ppvVar8 = (void **)((long)local_e8 + uVar6);
              }
              else {
                ppvVar8 = local_100;
                local_100 = local_100 + 1;
              }
              uVar17 = SUB84(*ppvVar8,0);
              pcVar12 = "%.17g ";
            }
            fprintf(*(FILE **)(MshIdx + 0x300410),pcVar12,uVar17);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (int)puVar16[3]);
      }
      goto switchD_001085c6_default;
    }
    if (0 < (int)puVar16[3]) {
      lVar9 = 0;
      iVar5 = 0;
      do {
        cVar2 = *(char *)((long)puVar16 + lVar9 + 0xfd8);
        if (cVar2 == 'c') {
          memset((void *)(*(long *)(MshIdx + 0x300428) + (long)iVar5),0,0x100);
          uVar6 = local_108 & 0xffffffff;
          if (uVar6 < 0x29) {
            local_108 = CONCAT44(local_108._4_4_,(uint)local_108 + 8);
            ppvVar8 = (void **)((long)local_e8 + uVar6);
          }
          else {
            ppvVar8 = local_100;
            local_100 = local_100 + 1;
          }
          strncpy((char *)(*(long *)(MshIdx + 0x300428) + (long)iVar5),(char *)*ppvVar8,0x100);
          iVar5 = iVar5 + 0x40;
        }
        else if (cVar2 == 'i') {
          uVar6 = local_108 & 0xffffffff;
          if (*(int *)(MshIdx + 4) < 4) {
            if ((uint)local_108 < 0x29) {
              local_108 = CONCAT44(local_108._4_4_,(uint)local_108 + 8);
              ppvVar8 = (void **)((long)local_e8 + uVar6);
            }
            else {
              ppvVar8 = local_100;
              local_100 = local_100 + 1;
            }
            *(undefined4 *)(*(long *)(MshIdx + 0x300428) + (long)iVar5) = *(undefined4 *)ppvVar8;
            goto LAB_00108739;
          }
          if ((uint)local_108 < 0x29) {
            local_108 = CONCAT44(local_108._4_4_,(uint)local_108 + 8);
            ppvVar8 = (void **)((long)local_e8 + uVar6);
          }
          else {
            ppvVar8 = local_100;
            local_100 = local_100 + 1;
          }
          *(void **)(*(long *)(MshIdx + 0x300428) + (long)iVar5) = *ppvVar8;
LAB_00108755:
          iVar5 = iVar5 + 8;
        }
        else if (cVar2 == 'r') {
          uVar6 = (ulong)local_108._4_4_;
          if (*(int *)(MshIdx + 0x18) != 0x20) {
            if (local_108._4_4_ < 0xa1) {
              local_108 = CONCAT44(local_108._4_4_ + 0x10,(uint)local_108);
              ppvVar8 = (void **)((long)local_e8 + uVar6);
            }
            else {
              ppvVar8 = local_100;
              local_100 = local_100 + 1;
            }
            *(void **)(*(long *)(MshIdx + 0x300428) + (long)iVar5) = *ppvVar8;
            goto LAB_00108755;
          }
          if (local_108._4_4_ < 0xa1) {
            local_108 = CONCAT44(local_108._4_4_ + 0x10,(uint)local_108);
            ppvVar8 = (void **)((long)local_e8 + uVar6);
          }
          else {
            ppvVar8 = local_100;
            local_100 = local_100 + 1;
          }
          *(float *)(*(long *)(MshIdx + 0x300428) + (long)iVar5) = (float)(double)*ppvVar8;
LAB_00108739:
          iVar5 = iVar5 + 4;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)puVar16[3]);
    }
    break;
  case 3:
    if (*(int *)(MshIdx + 0x18) == 0x20) {
      if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
        if (0 < (int)puVar16[3]) {
          lVar9 = 0;
          do {
            fprintf(*(FILE **)(MshIdx + 0x300410),"%.9g ",SUB84((double)(float)puVar11[lVar9],0));
            lVar9 = lVar9 + 1;
          } while (lVar9 < (int)puVar16[3]);
        }
        goto switchD_001085c6_default;
      }
    }
    else if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
      if (0 < (int)puVar16[3]) {
        lVar9 = 0;
        do {
          fprintf(*(FILE **)(MshIdx + 0x300410),"%.17g ",(int)*(undefined8 *)(puVar11 + lVar9 * 2));
          lVar9 = lVar9 + 1;
        } while (lVar9 < (int)puVar16[3]);
      }
      goto switchD_001085c6_default;
    }
    iVar5 = puVar16[4];
    goto LAB_00108aca;
  case 5:
    iVar5 = puVar16[3];
    if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
      if (0 < iVar5) {
        lVar10 = 0;
        do {
          cVar2 = *(char *)((long)puVar16 + lVar10 + 0xfd8);
          if (cVar2 == 'i') {
            bVar4 = iVar5 + -1 <= lVar10;
            if (*(int *)(MshIdx + 4) < 4) {
              if (bVar4 && ""[(uint)KwdCod] != '\0') {
                uVar3 = *puVar14;
              }
              else {
                uVar3 = puVar11[lVar10];
              }
              fprintf(*(FILE **)(MshIdx + 0x300410),"%d ",(ulong)uVar3);
            }
            else {
              if (bVar4 && ""[(uint)KwdCod] != '\0') {
                uVar3 = *puVar14;
              }
              else {
                uVar3 = puVar11[lVar10];
              }
              fprintf(*(FILE **)(MshIdx + 0x300410),"%ld ",(long)(int)uVar3);
            }
          }
          else if (cVar2 == 'r') {
            dVar1 = *(double *)(lVar9 + lVar10 * 8);
            uVar17 = SUB84(dVar1,0);
            if (*(int *)(MshIdx + 0x18) == 0x20) {
              uVar17 = SUB84((double)(float)dVar1,0);
              pcVar12 = "%.9g ";
            }
            else {
              pcVar12 = "%.17g ";
            }
            fprintf(*(FILE **)(MshIdx + 0x300410),pcVar12,uVar17);
          }
          lVar10 = lVar10 + 1;
          iVar5 = puVar16[3];
        } while (lVar10 < iVar5);
      }
      goto switchD_001085c6_default;
    }
    if (0 < iVar5) {
      uVar15 = 0;
      uVar6 = uVar15;
      do {
        cVar2 = *(char *)((long)puVar16 + uVar15 + 0xfd8);
        iVar13 = (int)uVar6;
        if (cVar2 == 'i') {
          puVar14 = puVar11;
          if ((long)(iVar5 + -1) <= (long)uVar15) {
            puVar14 = local_c8;
          }
          if (""[(uint)KwdCod] == '\0') {
            puVar14 = puVar11;
          }
          if (*(int *)(MshIdx + 4) < 4) {
            *(uint *)(*(long *)(MshIdx + 0x300428) + (long)iVar13) = *puVar14;
            uVar6 = (ulong)(iVar13 + 4);
            iVar5 = puVar16[3];
          }
          else {
            *(long *)(*(long *)(MshIdx + 0x300428) + (long)iVar13) = (long)(int)*puVar14;
LAB_00108a9e:
            uVar6 = (ulong)(iVar13 + 8);
          }
        }
        else if (cVar2 == 'r') {
          dVar1 = *(double *)(local_d0 + uVar15 * 8);
          if (*(int *)(MshIdx + 0x18) != 0x20) {
            *(double *)(*(long *)(MshIdx + 0x300428) + (long)iVar13) = dVar1;
            goto LAB_00108a9e;
          }
          *(float *)(*(long *)(MshIdx + 0x300428) + (long)iVar13) = (float)dVar1;
          uVar6 = (ulong)(iVar13 + 4);
        }
        uVar15 = uVar15 + 1;
        puVar11 = puVar11 + 1;
      } while ((long)uVar15 < (long)iVar5);
    }
    break;
  default:
    goto switchD_001085c6_default;
  }
  iVar5 = puVar16[4];
  puVar11 = *(uint **)(MshIdx + 0x300428);
LAB_00108aca:
  RecBlk((GmfMshSct *)MshIdx,puVar11,iVar5);
switchD_001085c6_default:
  if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
    fputc(10,*(FILE **)(MshIdx + 0x300410));
  }
  return 1;
}

Assistant:

int GmfSetLin(int64_t MshIdx, int KwdCod, ...)
{
   char        *str;
   int         i, pos, *IntBuf, err, typ, *IntTab, *RefPtr;
   int64_t     *LngBuf;
   float       *FltSolTab, *FltBuf;
   double      *DblSolTab, *DblBuf, *DblTab;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   // Special trick: if the kwd is negative the call come from Fortran
   if(KwdCod < 0)
   {
      // Set Fortran mode ON
      KwdCod = -KwdCod;
      kwd = &msh->KwdTab[ KwdCod ];
      typ = F77Kwd;
   }
   else
   {
      kwd = &msh->KwdTab[ KwdCod ];
      typ = kwd->typ;
   }

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);
 
   // Save the current stack environment for longjmp
   // This is needed in RecBlk()
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Save the current stack environment for longjmp
   // This is needed in RecBlk()
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Start decoding the arguments
   va_start(VarArg, KwdCod);

   switch(typ)
   {
      case InfKwd : case RegKwd : case CmtKwd :
      {
         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                     fprintf(msh->hdl, "%.9g ", va_arg(VarArg, double));
                  else
                     fprintf(msh->hdl, "%.17g ", va_arg(VarArg, double));
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                     fprintf(msh->hdl, "%d ", va_arg(VarArg, int));
                  else
                  {
                     // [Bruno] %ld -> INT64_T_FMT
                     fprintf(msh->hdl, INT64_T_FMT " ", va_arg(VarArg, int64_t));
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  // Safety check: if the string is greater than 64 characters
                  // truncate it with an ending 0
                  str = va_arg(VarArg, char *);

                  if(strlen(str) >= FilStrSiz)
                     str[ FilStrSiz ] = 0;

                  fputs(str, msh->hdl);
               }
            }
         }
         else
         {
            pos = 0;

            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     FltBuf = (void *)&msh->buf[ pos ];
                     *FltBuf = (float)va_arg(VarArg, double);
                     pos += 4;
                  }
                  else
                  {
                     DblBuf = (void *)&msh->buf[ pos ];
                     *DblBuf = va_arg(VarArg, double);
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     IntBuf = (void *)&msh->buf[ pos ];
                     *IntBuf = va_arg(VarArg, int);
                     pos += 4;
                  }
                  else
                  {
                     LngBuf = (void *)&msh->buf[ pos ];
                     *LngBuf = va_arg(VarArg, int64_t);
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  memset(&msh->buf[ pos ], 0, FilStrSiz * WrdSiz);
                  strncpy(&msh->buf[ pos ], va_arg(VarArg, char *), FilStrSiz * WrdSiz);
                  pos += FilStrSiz;
               }
            }

            RecBlk(msh, msh->buf, kwd->NmbWrd);
         }
      }break;

      case SolKwd :
      {
         if(msh->FltSiz == 32)
         {
            FltSolTab = va_arg(VarArg, float *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  fprintf(msh->hdl, "%.9g ", (double)FltSolTab[i]);
            else
               RecBlk(msh, (unsigned char *)FltSolTab, kwd->NmbWrd);
         }
         else
         {
            DblSolTab = va_arg(VarArg, double *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  fprintf(msh->hdl, "%.17g ", DblSolTab[i]);
            else
               RecBlk(msh, (unsigned char *)DblSolTab, kwd->NmbWrd);
         }
      }break;

      case F77Kwd :
      {
         IntTab = va_arg(VarArg, int *);
         DblTab = va_arg(VarArg, double *);
         RefPtr = va_arg(VarArg, int *);

         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                     fprintf(msh->hdl, "%.9g ", (float)DblTab[i]);
                  else
                     fprintf(msh->hdl, "%.17g ", DblTab[i]);
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        fprintf(msh->hdl, "%d ", IntTab[i]);
                     else
                        fprintf(msh->hdl, "%d ", *RefPtr);
                  else
                  {
                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        fprintf(msh->hdl, INT64_T_FMT " ", (int64_t)IntTab[i]);
                     else
                        fprintf(msh->hdl, INT64_T_FMT " ", (int64_t)*RefPtr);
                  }
               }
            }
         }
         else
         {
            pos = 0;

            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     FltBuf = (void *)&msh->buf[ pos ];
                     *FltBuf = (float)DblTab[i];
                     pos += 4;
                  }
                  else
                  {
                     DblBuf = (void *)&msh->buf[ pos ];
                     *DblBuf = DblTab[i];
                     pos += 8;
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     IntBuf = (void *)&msh->buf[ pos ];

                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        *IntBuf = IntTab[i];
                     else
                        *IntBuf = *RefPtr;

                     pos += 4;
                  }
                  else
                  {
                     LngBuf = (void *)&msh->buf[ pos ];

                     if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                        *LngBuf = (int64_t)IntTab[i];
                     else
                        *LngBuf = (int64_t)*RefPtr;

                     pos += 8;
                  }
               }
            }

            RecBlk(msh, msh->buf, kwd->NmbWrd);
         }
      }break;
   }

   va_end(VarArg);

   if(msh->typ & Asc)
      fprintf(msh->hdl, "\n");

   return(1);
}